

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

int __thiscall
TPZMatrix<std::complex<float>_>::Decompose_LDLt(TPZMatrix<std::complex<float>_> *this)

{
  int iVar1;
  bool bVar2;
  complex<float> *__z;
  complex<float> *pcVar3;
  int64_t iVar4;
  complex<float> a;
  TPZBaseMatrix *in_RDI;
  complex<float> val;
  int k_1;
  complex<float> sum_1;
  int l;
  complex<float> tmp;
  int k;
  complex<float> sum;
  int j;
  int dim;
  char *in_stack_00000108;
  char *in_stack_00000110;
  complex<float> *in_stack_ffffffffffffff08;
  complex<float> local_c0 [7];
  int local_88;
  complex<float> local_84;
  int local_7c;
  undefined1 local_5c [56];
  int local_24;
  complex<float> local_20;
  int local_18;
  int local_14;
  
  if ((in_RDI->fDecomposed == '\0') || (in_RDI->fDecomposed == '\x04')) {
    if (in_RDI->fDecomposed != '\0') {
      return 4;
    }
  }
  else {
    Error(in_stack_00000110,in_stack_00000108);
  }
  __z = (complex<float> *)TPZBaseMatrix::Rows(in_RDI);
  pcVar3 = (complex<float> *)TPZBaseMatrix::Cols(in_RDI);
  if (__z != pcVar3) {
    Error(in_stack_00000110,in_stack_00000108);
  }
  iVar4 = TPZBaseMatrix::Rows(in_RDI);
  local_14 = (int)iVar4;
  for (local_18 = 0; local_18 < local_14; local_18 = local_18 + 1) {
    std::complex<float>::complex(&local_20,0.0,0.0);
    for (local_24 = 0; local_24 < local_18; local_24 = local_24 + 1) {
      (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,(long)local_24);
      (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,(long)local_24,(long)local_18);
      std::conj<float>(in_stack_ffffffffffffff08);
      std::operator*(in_stack_ffffffffffffff08,(complex<float> *)0x12ad521);
      (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,(long)local_24,(long)local_18);
      std::operator*(in_stack_ffffffffffffff08,(complex<float> *)0x12ad569);
      std::complex<float>::operator+=((complex<float> *)in_RDI,__z);
    }
    a._M_value = (_ComplexT)local_18;
    (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,a._M_value);
    std::operator-(in_stack_ffffffffffffff08,(complex<float> *)0x12ad5dc);
    (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])(in_RDI,a._M_value,a._M_value,local_5c);
    (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,(long)local_18);
    bVar2 = IsZero(a);
    iVar1 = local_18;
    if (bVar2) {
      Error(in_stack_00000110,in_stack_00000108);
      iVar1 = local_18;
    }
    while (local_7c = iVar1 + 1, local_7c < local_14) {
      std::complex<float>::complex(&local_84,0.0,0.0);
      for (local_88 = 0; local_88 < local_18; local_88 = local_88 + 1) {
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,(long)local_88);
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,(long)local_18,(long)local_88);
        std::conj<float>(in_stack_ffffffffffffff08);
        std::operator*(in_stack_ffffffffffffff08,(complex<float> *)0x12ad709);
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,(long)local_7c,(long)local_88);
        std::operator*(in_stack_ffffffffffffff08,(complex<float> *)0x12ad73f);
        std::complex<float>::operator+=((complex<float> *)in_RDI,__z);
      }
      (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,(long)local_7c,(long)local_18);
      std::operator-(in_stack_ffffffffffffff08,(complex<float> *)0x12ad797);
      std::operator/(in_stack_ffffffffffffff08,(complex<float> *)0x12ad7af);
      in_stack_ffffffffffffff08 = local_c0;
      (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])(in_RDI,(long)local_7c,(long)local_18);
      std::conj<float>(in_stack_ffffffffffffff08);
      (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])
                (in_RDI,(long)local_18,(long)local_7c,local_c0);
      iVar1 = local_7c;
    }
  }
  in_RDI->fDecomposed = '\x04';
  in_RDI->fDefPositive = '\0';
  return 1;
}

Assistant:

int TPZMatrix<TVar>::Decompose_LDLt() {
	
	if (  fDecomposed && fDecomposed != ELDLt) {
		Error( "Decompose_LDLt <Matrix already Decomposed with other scheme> " );
	} else if(fDecomposed ) {
		return ELDLt;
	}
	if ( Rows()!=Cols() ) Error( "Decompose_LDLt <Matrix must be square>" );
	
	const int dim=Rows();
	
	for (auto j = 0; j < dim; j++ ) {
        TVar sum = 0;
		for (auto k=0; k<j; k++) {
            if constexpr(is_complex<TVar>::value){
                sum +=GetVal(k,k)*std::conj(GetVal(k,j))*GetVal(k,j);
            }else{
                sum +=GetVal(k,k)*GetVal(k,j)*GetVal(k,j);
            }   
		}
        PutVal( j,j,GetVal(j,j) - sum );
		TVar tmp = GetVal(j,j);
		if ( IsZero(tmp) ) Error( "Decompose_LDLt <Zero on diagonal>" );
        for(auto l=j+1; l<dim;l++) {
            TVar sum = 0;
            for (auto k=0; k<j; k++) {
                if constexpr(is_complex<TVar>::value){
                    sum += GetVal(k,k)*std::conj(GetVal(j,k))*GetVal(l,k);
                }else{
                    sum += GetVal(k,k)*GetVal(j,k)*GetVal(l,k);
                }
			}
            TVar val = (GetVal(l,j) - sum)/tmp;
            PutVal(l,j,val);
            if constexpr(is_complex<TVar>::value){val=std::conj(val);}
            PutVal(j,l,val);
		}
	}
	fDecomposed  = ELDLt;
	fDefPositive = 0;
	return( 1 );
}